

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_trace_scan.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_trace_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  uint uVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  long lVar7;
  byte bVar8;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int Ft_ext_1;
  int Ht_pre_1;
  int Ft_opn_1;
  int H_dag_1;
  int matval_1;
  int E_ext_1;
  int E_opn_1;
  int Ft_1;
  int Ft_ext;
  int Ht_pre;
  int Ft_opn;
  int H_dag;
  int matval;
  int E_ext;
  int E_opn;
  int Ft;
  int end_ref;
  int end_query;
  int score;
  int s1Len;
  int j;
  int i;
  int *Ex;
  int8_t *HT;
  int *Ht;
  int *HtB;
  int *E;
  int *H;
  int *HB;
  int *s2;
  int *s1;
  parasail_result_t *result;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  
  s2 = (int *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_trace_scan","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_trace_scan","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_trace_scan","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_trace_scan","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_trace_scan","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_trace_scan","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_trace_scan","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_e4 = _s1Len;
    if (matrix->type != 0) {
      local_e4 = matrix->length;
    }
    end_ref = -0x40000000;
    Ft = local_e4;
    _s1_local = (char *)parasail_result_new_trace(local_e4,s2Len,0x10,1);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x1480202;
      uVar2 = 0;
      if (s1_beg != 0) {
        uVar2 = 8;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar2 | ((parasail_result_t *)_s1_local)->flag;
      uVar2 = 0;
      if (s1_end != 0) {
        uVar2 = 0x10;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar2 | ((parasail_result_t *)_s1_local)->flag;
      uVar2 = 0;
      if (s2_beg != 0) {
        uVar2 = 0x4000;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar2 | ((parasail_result_t *)_s1_local)->flag;
      uVar2 = 0;
      if (s2_end != 0) {
        uVar2 = 0x8000;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar2 | ((parasail_result_t *)_s1_local)->flag;
      ptr = parasail_memalign_int(0x10,(long)s2Len);
      ptr_00 = parasail_memalign_int(0x10,(long)(local_e4 + 1));
      ptr_01 = parasail_memalign_int(0x10,(long)local_e4);
      ptr_02 = parasail_memalign_int(0x10,(long)(local_e4 + 1));
      ptr_03 = parasail_memalign_int(0x10,(long)local_e4);
      piVar1 = ((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_row;
      if (ptr == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_02 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_03 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        if (matrix->type == 0) {
          s2 = parasail_memalign_int(0x10,(long)local_e4);
          if (s2 == (int *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (s1Len = 0; s1Len < local_e4; s1Len = s1Len + 1) {
            s2[s1Len] = matrix->mapper[(byte)_s1[s1Len]];
          }
        }
        for (score = 0; score < s2Len; score = score + 1) {
          ptr[score] = matrix->mapper[(byte)_s2[score]];
        }
        *ptr_00 = 0;
        *ptr_02 = 0;
        if (s1_beg == 0) {
          for (s1Len = 0; s1Len < local_e4; s1Len = s1Len + 1) {
            ptr_00[(long)s1Len + 1] = -(s1Len * gap) - open;
          }
        }
        else {
          for (s1Len = 0; s1Len < local_e4; s1Len = s1Len + 1) {
            ptr_00[(long)s1Len + 1] = 0;
          }
        }
        for (s1Len = 0; s1Len < local_e4; s1Len = s1Len + 1) {
          ptr_01[s1Len] = -0x40000000;
        }
        E_opn = s2Len;
        for (score = 0; score < s2Len + -1; score = score + 1) {
          E_ext = -0x40000000;
          for (s1Len = 0; s1Len < local_e4; s1Len = s1Len + 1) {
            iVar4 = ptr_00[(long)s1Len + 1] - open;
            iVar5 = ptr_01[s1Len] - gap;
            local_e8 = iVar4;
            if (iVar4 < iVar5) {
              local_e8 = iVar5;
            }
            ptr_01[s1Len] = local_e8;
            uVar3 = 0x10;
            if (iVar5 < iVar4) {
              uVar3 = 8;
            }
            *(undefined1 *)((long)piVar1 + (long)s1Len * (long)s2Len + (long)score) = uVar3;
          }
          if (s2_beg == 0) {
            local_ec = -(score * gap) - open;
          }
          else {
            local_ec = 0;
          }
          *ptr_02 = local_ec;
          for (s1Len = 0; s1Len < local_e4; s1Len = s1Len + 1) {
            if (matrix->type == 0) {
              local_f0 = matrix->matrix[matrix->size * s2[s1Len] + ptr[score]];
            }
            else {
              local_f0 = matrix->matrix[matrix->size * s1Len + ptr[score]];
            }
            local_f0 = ptr_00[(long)(s1Len + -1) + 1] + local_f0;
            local_f4 = local_f0;
            if (local_f0 <= ptr_01[s1Len]) {
              local_f4 = ptr_01[s1Len];
            }
            ptr_02[(long)s1Len + 1] = local_f4;
            ptr_03[s1Len] = (uint)(local_f0 < ptr_01[s1Len]);
          }
          for (s1Len = 0; s1Len < local_e4; s1Len = s1Len + 1) {
            iVar4 = E_ext - gap;
            E_ext = iVar4;
            if (iVar4 <= ptr_02[(long)(s1Len + -1) + 1]) {
              E_ext = ptr_02[(long)(s1Len + -1) + 1];
            }
            iVar5 = E_ext - open;
            if (iVar4 < ptr_00[(long)(s1Len + -1) + 1]) {
              lVar7 = (long)s1Len * (long)s2Len + (long)score;
              *(byte *)((long)piVar1 + lVar7) = *(byte *)((long)piVar1 + lVar7) | 0x20;
            }
            else {
              lVar7 = (long)s1Len * (long)s2Len + (long)score;
              *(byte *)((long)piVar1 + lVar7) = *(byte *)((long)piVar1 + lVar7) | 0x40;
            }
            if (iVar5 < ptr_02[(long)s1Len + 1]) {
              ptr_00[(long)s1Len + 1] = ptr_02[(long)s1Len + 1];
              bVar8 = 4;
              if (ptr_03[s1Len] != 0) {
                bVar8 = 1;
              }
              lVar7 = (long)s1Len * (long)s2Len + (long)score;
              *(byte *)((long)piVar1 + lVar7) = *(byte *)((long)piVar1 + lVar7) | bVar8;
            }
            else {
              ptr_00[(long)s1Len + 1] = iVar5;
              if (ptr_02[(long)s1Len + 1] == iVar5) {
                if (ptr_03[s1Len] == 0) {
                  lVar7 = (long)s1Len * (long)s2Len + (long)score;
                  *(byte *)((long)piVar1 + lVar7) = *(byte *)((long)piVar1 + lVar7) | 4;
                }
                else {
                  lVar7 = (long)s1Len * (long)s2Len + (long)score;
                  *(byte *)((long)piVar1 + lVar7) = *(byte *)((long)piVar1 + lVar7) | 2;
                }
              }
              else {
                lVar7 = (long)s1Len * (long)s2Len + (long)score;
                *(byte *)((long)piVar1 + lVar7) = *(byte *)((long)piVar1 + lVar7) | 2;
              }
            }
          }
          if (s2_beg == 0) {
            local_f8 = -(score * gap) - open;
          }
          else {
            local_f8 = 0;
          }
          *ptr_00 = local_f8;
          if ((s2_end != 0) && (end_ref < ptr_00[(long)(local_e4 + -1) + 1])) {
            end_ref = ptr_00[(long)(local_e4 + -1) + 1];
            Ft = local_e4 + -1;
            E_opn = score;
          }
        }
        iVar4 = s2Len + -1;
        E_ext_1 = -0x40000000;
        for (s1Len = 0; s1Len < local_e4; s1Len = s1Len + 1) {
          iVar5 = ptr_00[(long)s1Len + 1] - open;
          iVar6 = ptr_01[s1Len] - gap;
          local_fc = iVar5;
          if (iVar5 < iVar6) {
            local_fc = iVar6;
          }
          ptr_01[s1Len] = local_fc;
          uVar3 = 0x10;
          if (iVar6 < iVar5) {
            uVar3 = 8;
          }
          *(undefined1 *)((long)piVar1 + (long)s1Len * (long)s2Len + (long)iVar4) = uVar3;
        }
        if (s2_beg == 0) {
          local_100 = -(iVar4 * gap) - open;
        }
        else {
          local_100 = 0;
        }
        *ptr_02 = local_100;
        for (s1Len = 0; s1Len < local_e4; s1Len = s1Len + 1) {
          if (matrix->type == 0) {
            local_104 = matrix->matrix[matrix->size * s2[s1Len] + ptr[iVar4]];
          }
          else {
            local_104 = matrix->matrix[matrix->size * s1Len + ptr[iVar4]];
          }
          local_104 = ptr_00[(long)(s1Len + -1) + 1] + local_104;
          local_108 = local_104;
          if (local_104 <= ptr_01[s1Len]) {
            local_108 = ptr_01[s1Len];
          }
          ptr_02[(long)s1Len + 1] = local_108;
          ptr_03[s1Len] = (uint)(local_104 < ptr_01[s1Len]);
        }
        for (s1Len = 0; s1Len < local_e4; s1Len = s1Len + 1) {
          iVar5 = E_ext_1 - gap;
          E_ext_1 = iVar5;
          if (iVar5 <= ptr_02[(long)(s1Len + -1) + 1]) {
            E_ext_1 = ptr_02[(long)(s1Len + -1) + 1];
          }
          iVar6 = E_ext_1 - open;
          if (iVar5 < ptr_00[(long)(s1Len + -1) + 1]) {
            lVar7 = (long)s1Len * (long)s2Len + (long)iVar4;
            *(byte *)((long)piVar1 + lVar7) = *(byte *)((long)piVar1 + lVar7) | 0x20;
          }
          else {
            lVar7 = (long)s1Len * (long)s2Len + (long)iVar4;
            *(byte *)((long)piVar1 + lVar7) = *(byte *)((long)piVar1 + lVar7) | 0x40;
          }
          if (iVar6 < ptr_02[(long)s1Len + 1]) {
            ptr_00[(long)s1Len + 1] = ptr_02[(long)s1Len + 1];
            bVar8 = 4;
            if (ptr_03[s1Len] != 0) {
              bVar8 = 1;
            }
            lVar7 = (long)s1Len * (long)s2Len + (long)iVar4;
            *(byte *)((long)piVar1 + lVar7) = *(byte *)((long)piVar1 + lVar7) | bVar8;
          }
          else {
            ptr_00[(long)s1Len + 1] = iVar6;
            if (ptr_02[(long)s1Len + 1] == iVar6) {
              if (ptr_03[s1Len] == 0) {
                lVar7 = (long)s1Len * (long)s2Len + (long)iVar4;
                *(byte *)((long)piVar1 + lVar7) = *(byte *)((long)piVar1 + lVar7) | 4;
              }
              else {
                lVar7 = (long)s1Len * (long)s2Len + (long)iVar4;
                *(byte *)((long)piVar1 + lVar7) = *(byte *)((long)piVar1 + lVar7) | 2;
              }
            }
            else {
              lVar7 = (long)s1Len * (long)s2Len + (long)iVar4;
              *(byte *)((long)piVar1 + lVar7) = *(byte *)((long)piVar1 + lVar7) | 2;
            }
          }
          if ((s1_end != 0) && (end_ref < ptr_00[(long)s1Len + 1])) {
            end_ref = ptr_00[(long)s1Len + 1];
            Ft = s1Len;
            E_opn = iVar4;
          }
        }
        if ((s2_end != 0) && (end_ref < ptr_00[(long)(local_e4 + -1) + 1])) {
          end_ref = ptr_00[(long)(local_e4 + -1) + 1];
          Ft = local_e4 + -1;
          E_opn = s2Len + -1;
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          end_ref = ptr_00[(long)(local_e4 + -1) + 1];
          Ft = local_e4 + -1;
          E_opn = s2Len + -1;
        }
        ((parasail_result_t *)_s1_local)->score = end_ref;
        ((parasail_result_t *)_s1_local)->end_query = Ft;
        ((parasail_result_t *)_s1_local)->end_ref = E_opn;
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict E = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int8_t * restrict HT = NULL;
    int * restrict Ex = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
    result = parasail_result_new_trace(s1Len, s2Len, 16, sizeof(int8_t));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    E  = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;
    Ex = parasail_memalign_int(16, s1Len);
    HT = (int8_t* restrict)result->trace->trace_table;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!E) return NULL;
    if (!HtB) return NULL;
    if (!Ex) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H */
    H[-1] = 0;
    Ht[-1] = 0;
    if (s1_beg) {
        for (i=0; i<s1Len; ++i) {
            H[i] = 0;
        }
    }
    else {
        for (i=0; i<s1Len; ++i) {
            H[i] = -open -i*gap;
        }
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
    }

    /* iterate over database */
    for (j=0; j<s2Len-1; ++j) {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            E[i] = MAX(E_ext, E_opn);
            HT[1LL*i*s2Len + j] = (E_opn > E_ext) ? PARASAIL_DIAG_E
                                                  : PARASAIL_INS_E;
        }
        /* calculate Ht */
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ht[i] = MAX(H_dag, E[i]);
            Ex[i] = (E[i] > H_dag);
        }
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                HT[1LL*i*s2Len + j] |= PARASAIL_DIAG_F;
            }
            else {
                HT[1LL*i*s2Len + j] |= PARASAIL_DEL_F;
            }
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HT[1LL*i*s2Len + j] |= Ex[i] ? PARASAIL_INS : PARASAIL_DIAG;
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        HT[1LL*i*s2Len + j] |= PARASAIL_DEL;
                    }
                    else {
                        HT[1LL*i*s2Len + j] |= PARASAIL_DIAG;
                    }
                }
                else {
                    HT[1LL*i*s2Len + j] |= PARASAIL_DEL;
                }
            }
        }
        H[-1] = s2_beg ? 0 : (-open - j*gap);
        if (s2_end && H[s1Len-1] > score) {
            score = H[s1Len-1];
            end_query = s1Len-1;
            end_ref = j;
        }
    }
    j = s2Len - 1;
    {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            E[i] = MAX(E_ext, E_opn);
            HT[1LL*i*s2Len + j] = (E_opn > E_ext) ? PARASAIL_DIAG_E
                                                  : PARASAIL_INS_E;
        }
        /* calculate Ht */
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ht[i] = MAX(H_dag, E[i]);
            Ex[i] = (E[i] > H_dag);
        }
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                HT[1LL*i*s2Len + j] |= PARASAIL_DIAG_F;
            }
            else {
                HT[1LL*i*s2Len + j] |= PARASAIL_DEL_F;
            }
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HT[1LL*i*s2Len + j] |= Ex[i] ? PARASAIL_INS : PARASAIL_DIAG;
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        HT[1LL*i*s2Len + j] |= PARASAIL_DEL;
                    }
                    else {
                        HT[1LL*i*s2Len + j] |= PARASAIL_DIAG;
                    }
                }
                else {
                    HT[1LL*i*s2Len + j] |= PARASAIL_DEL;
                }
            }
            if (s1_end && H[i] > score) {
                score = H[i];
                end_query = i;
                end_ref = j;
            }
        }
    }
    if (s2_end && H[s1Len-1] > score) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }
    if (!s1_end && !s2_end) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(Ex);
    parasail_free(HtB);
    parasail_free(E);
    parasail_free(HB);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}